

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O3

size_type __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::find_last_of
          (basic_string_view<char,_std::char_traits<char>_> *this,
          basic_string_view<char,_std::char_traits<char>_> v,size_type pos)

{
  ulong uVar1;
  const_pointer pcVar2;
  ulong uVar3;
  const_pointer pcVar4;
  const_pointer pcVar5;
  size_type sVar6;
  
  uVar1 = this->size_;
  if (uVar1 == 0) {
    return 0xffffffffffffffff;
  }
  do {
    uVar3 = pos;
    pos = uVar1 - 1;
  } while (uVar1 <= uVar3);
  pcVar2 = this->data_;
  for (pcVar4 = pcVar2 + uVar3 + 1; pcVar5 = pcVar2, pcVar4 != pcVar2; pcVar4 = pcVar4 + -1) {
    if (v.size_ != 0) {
      sVar6 = 0;
      do {
        pcVar5 = pcVar4;
        if (pcVar4[-1] == v.data_[sVar6]) goto LAB_00186d9e;
        sVar6 = sVar6 + 1;
      } while (v.size_ != sVar6);
    }
  }
LAB_00186d9e:
  pcVar4 = (const_pointer)0xffffffffffffffff;
  if (pcVar5 != pcVar2) {
    pcVar4 = pcVar5 + ~(ulong)pcVar2;
  }
  return (size_type)pcVar4;
}

Assistant:

nssv_constexpr size_type find_last_of(basic_string_view v, size_type pos = npos) const nssv_noexcept  // (1)
		{
			return empty() ? npos
						   : pos >= size() ? find_last_of(v, size() - 1)
										   : to_pos(std::find_first_of(const_reverse_iterator(cbegin() + pos + 1),
																	   crend(), v.cbegin(), v.cend(), Traits::eq));
		}